

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>_> __thiscall
kj::
heap<kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>,kj::Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>>>
          (kj *this,Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>_> *params
          )

{
  ForkBranch<capnproto_test::capnp::test::TestInterface::Client> *this_00;
  ForkBranch<capnproto_test::capnp::test::TestInterface::Client> *extraout_RDX;
  Own<kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>_> OVar1;
  Own<kj::_::ForkHubBase> local_28;
  
  this_00 = (ForkBranch<capnproto_test::capnp::test::TestInterface::Client> *)operator_new(0x30);
  local_28.disposer = params->disposer;
  local_28.ptr = &params->ptr->super_ForkHubBase;
  params->ptr = (ForkHub<capnproto_test::capnp::test::TestInterface::Client> *)0x0;
  _::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>::ForkBranch(this_00,&local_28);
  *(undefined8 **)this =
       &_::HeapDisposer<kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>>::
        instance;
  *(ForkBranch<capnproto_test::capnp::test::TestInterface::Client> **)(this + 8) = this_00;
  Own<kj::_::ForkHubBase>::dispose(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}